

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  byte bVar23;
  long lVar24;
  long lVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar35 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined4 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  uint uVar67;
  uint uVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 local_2648 [16];
  Geometry *local_2638;
  ulong local_2630;
  Scene *local_2628;
  ulong local_2620;
  StackItemT<embree::NodeRefPtr<8>_> *local_2618;
  long local_2610;
  RTCFilterFunctionNArguments args;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  byte local_2587;
  float local_2578 [4];
  float local_2568 [4];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2618 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar71 = ZEXT3264(auVar50);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar72 = ZEXT3264(auVar51);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar73 = ZEXT3264(auVar52);
  auVar35 = vmulss_avx512f(auVar50._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar57 = auVar35._0_4_;
  auVar50._4_4_ = uVar57;
  auVar50._0_4_ = uVar57;
  auVar50._8_4_ = uVar57;
  auVar50._12_4_ = uVar57;
  auVar50._16_4_ = uVar57;
  auVar50._20_4_ = uVar57;
  auVar50._24_4_ = uVar57;
  auVar50._28_4_ = uVar57;
  auVar35 = vmulss_avx512f(auVar51._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar57 = auVar35._0_4_;
  auVar51._4_4_ = uVar57;
  auVar51._0_4_ = uVar57;
  auVar51._8_4_ = uVar57;
  auVar51._12_4_ = uVar57;
  auVar51._16_4_ = uVar57;
  auVar51._20_4_ = uVar57;
  auVar51._24_4_ = uVar57;
  auVar51._28_4_ = uVar57;
  auVar35 = vmulss_avx512f(auVar52._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar57 = auVar35._0_4_;
  auVar52._4_4_ = uVar57;
  auVar52._0_4_ = uVar57;
  auVar52._8_4_ = uVar57;
  auVar52._12_4_ = uVar57;
  auVar52._16_4_ = uVar57;
  auVar52._20_4_ = uVar57;
  auVar52._24_4_ = uVar57;
  auVar52._28_4_ = uVar57;
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar30 = uVar28 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar59 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  auVar53._8_4_ = 0x80000000;
  auVar53._0_8_ = 0x8000000080000000;
  auVar53._12_4_ = 0x80000000;
  auVar53._16_4_ = 0x80000000;
  auVar53._20_4_ = 0x80000000;
  auVar53._24_4_ = 0x80000000;
  auVar53._28_4_ = 0x80000000;
  auVar50 = vxorps_avx512vl(auVar50,auVar53);
  auVar74 = ZEXT3264(auVar50);
  auVar50 = vxorps_avx512vl(auVar51,auVar53);
  auVar75 = ZEXT3264(auVar50);
  auVar50 = vxorps_avx512vl(auVar52,auVar53);
  auVar76 = ZEXT3264(auVar50);
  auVar50 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar77 = ZEXT3264(auVar50);
  auVar35 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar78 = ZEXT1664(auVar35);
  auVar50 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar79 = ZEXT3264(auVar50);
  auVar50 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar80 = ZEXT3264(auVar50);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar81 = ZEXT1664(auVar35);
  auVar50 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar82 = ZEXT3264(auVar50);
  local_2620 = uVar28;
  do {
    pSVar22 = local_2618 + -1;
    local_2618 = local_2618 + -1;
    if ((float)pSVar22->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar32 = (local_2618->ptr).ptr;
      while ((sVar32 & 8) == 0) {
        auVar50 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar28),auVar74._0_32_,
                             auVar71._0_32_);
        auVar51 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar29),auVar75._0_32_,
                             auVar72._0_32_);
        auVar50 = vpmaxsd_avx2(auVar50,auVar51);
        auVar51 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar33),auVar76._0_32_,
                             auVar73._0_32_);
        auVar51 = vpmaxsd_avx512vl(auVar51,auVar77._0_32_);
        auVar50 = vpmaxsd_avx2(auVar50,auVar51);
        auVar51 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar32 + 0x40 + uVar30),auVar74._0_32_,
                             auVar71._0_32_);
        auVar52 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar32 + 0x40 + (uVar29 ^ 0x20)),auVar75._0_32_,
                             auVar72._0_32_);
        auVar51 = vpminsd_avx2(auVar51,auVar52);
        auVar52 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar32 + 0x40 + (uVar33 ^ 0x20)),auVar76._0_32_,
                             auVar73._0_32_);
        auVar52 = vpminsd_avx2(auVar52,auVar59._0_32_);
        auVar51 = vpminsd_avx2(auVar51,auVar52);
        uVar34 = vpcmpd_avx512vl(auVar50,auVar51,2);
        bVar23 = (byte)uVar34;
        if (bVar23 == 0) goto LAB_00782a54;
        auVar51 = *(undefined1 (*) [32])(sVar32 & 0xfffffffffffffff0);
        auVar52 = ((undefined1 (*) [32])(sVar32 & 0xfffffffffffffff0))[1];
        auVar53 = vmovdqa64_avx512vl(auVar79._0_32_);
        auVar53 = vpternlogd_avx512vl(auVar53,auVar50,auVar80._0_32_,0xf8);
        auVar54 = vpcompressd_avx512vl(auVar53);
        auVar55._0_4_ =
             (uint)(bVar23 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar53._0_4_;
        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar53._4_4_;
        bVar12 = (bool)((byte)(uVar34 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar53._8_4_;
        bVar12 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar12 * auVar54._12_4_ | (uint)!bVar12 * auVar53._12_4_;
        bVar12 = (bool)((byte)(uVar34 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar12 * auVar54._16_4_ | (uint)!bVar12 * auVar53._16_4_;
        bVar12 = (bool)((byte)(uVar34 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar12 * auVar54._20_4_ | (uint)!bVar12 * auVar53._20_4_;
        bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar12 * auVar54._24_4_ | (uint)!bVar12 * auVar53._24_4_;
        bVar12 = SUB81(uVar34 >> 7,0);
        auVar55._28_4_ = (uint)bVar12 * auVar54._28_4_ | (uint)!bVar12 * auVar53._28_4_;
        auVar53 = vpermt2q_avx512vl(auVar51,auVar55,auVar52);
        sVar32 = auVar53._0_8_;
        bVar23 = bVar23 - 1 & bVar23;
        if (bVar23 != 0) {
          auVar53 = vpshufd_avx2(auVar55,0x55);
          vpermt2q_avx512vl(auVar51,auVar53,auVar52);
          auVar54 = vpminsd_avx2(auVar55,auVar53);
          auVar53 = vpmaxsd_avx2(auVar55,auVar53);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar55 = vpermi2q_avx512vl(auVar54,auVar51,auVar52);
            sVar32 = auVar55._0_8_;
            auVar51 = vpermt2q_avx512vl(auVar51,auVar53,auVar52);
            (local_2618->ptr).ptr = auVar51._0_8_;
            auVar50 = vpermd_avx2(auVar53,auVar50);
            local_2618->dist = auVar50._0_4_;
            local_2618 = local_2618 + 1;
          }
          else {
            auVar14 = vpshufd_avx2(auVar55,0xaa);
            vpermt2q_avx512vl(auVar51,auVar14,auVar52);
            auVar64 = vpminsd_avx2(auVar54,auVar14);
            auVar54 = vpmaxsd_avx2(auVar54,auVar14);
            auVar14 = vpminsd_avx2(auVar53,auVar54);
            auVar53 = vpmaxsd_avx2(auVar53,auVar54);
            bVar23 = bVar23 - 1 & bVar23;
            if (bVar23 == 0) {
              auVar55 = vpermi2q_avx512vl(auVar64,auVar51,auVar52);
              sVar32 = auVar55._0_8_;
              auVar55 = vpermt2q_avx512vl(auVar51,auVar53,auVar52);
              (local_2618->ptr).ptr = auVar55._0_8_;
              auVar53 = vpermd_avx2(auVar53,auVar50);
              local_2618->dist = auVar53._0_4_;
              auVar51 = vpermt2q_avx512vl(auVar51,auVar14,auVar52);
              local_2618[1].ptr.ptr = auVar51._0_8_;
              auVar50 = vpermd_avx2(auVar14,auVar50);
              local_2618[1].dist = auVar50._0_4_;
              local_2618 = local_2618 + 2;
            }
            else {
              auVar54 = vpshufd_avx2(auVar55,0xff);
              vpermt2q_avx512vl(auVar51,auVar54,auVar52);
              auVar13 = vpminsd_avx2(auVar64,auVar54);
              auVar54 = vpmaxsd_avx2(auVar64,auVar54);
              auVar64 = vpminsd_avx2(auVar14,auVar54);
              auVar54 = vpmaxsd_avx2(auVar14,auVar54);
              auVar14 = vpminsd_avx2(auVar53,auVar54);
              auVar53 = vpmaxsd_avx2(auVar53,auVar54);
              bVar23 = bVar23 - 1 & bVar23;
              if (bVar23 == 0) {
                auVar55 = vpermi2q_avx512vl(auVar13,auVar51,auVar52);
                sVar32 = auVar55._0_8_;
                auVar55 = vpermt2q_avx512vl(auVar51,auVar53,auVar52);
                (local_2618->ptr).ptr = auVar55._0_8_;
                auVar53 = vpermd_avx2(auVar53,auVar50);
                local_2618->dist = auVar53._0_4_;
                auVar53 = vpermt2q_avx512vl(auVar51,auVar14,auVar52);
                local_2618[1].ptr.ptr = auVar53._0_8_;
                auVar53 = vpermd_avx2(auVar14,auVar50);
                local_2618[1].dist = auVar53._0_4_;
                auVar51 = vpermt2q_avx512vl(auVar51,auVar64,auVar52);
                local_2618[2].ptr.ptr = auVar51._0_8_;
                auVar50 = vpermd_avx2(auVar64,auVar50);
                local_2618[2].dist = auVar50._0_4_;
                local_2618 = local_2618 + 3;
              }
              else {
                auVar56 = valignd_avx512vl(auVar55,auVar55,3);
                auVar54 = vpermt2d_avx512vl(auVar81._0_32_,auVar82._0_32_,auVar13);
                auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar54 = vpermt2d_avx512vl(auVar54,auVar55,auVar64);
                auVar54 = vpermt2d_avx512vl(auVar54,auVar55,auVar14);
                auVar55 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar53 = vpermt2d_avx512vl(auVar54,auVar55,auVar53);
                auVar65 = ZEXT3264(auVar53);
                bVar26 = bVar23;
                do {
                  auVar55 = auVar65._0_32_;
                  auVar64._8_4_ = 1;
                  auVar64._0_8_ = 0x100000001;
                  auVar64._12_4_ = 1;
                  auVar64._16_4_ = 1;
                  auVar64._20_4_ = 1;
                  auVar64._24_4_ = 1;
                  auVar64._28_4_ = 1;
                  auVar53 = vpermd_avx2(auVar64,auVar56);
                  auVar56 = valignd_avx512vl(auVar56,auVar56,1);
                  vpermt2q_avx512vl(auVar51,auVar56,auVar52);
                  bVar26 = bVar26 - 1 & bVar26;
                  uVar18 = vpcmpd_avx512vl(auVar53,auVar55,5);
                  auVar53 = vpmaxsd_avx2(auVar53,auVar55);
                  bVar19 = (byte)uVar18 << 1;
                  auVar55 = valignd_avx512vl(auVar55,auVar55,7);
                  bVar12 = (bool)((byte)uVar18 & 1);
                  auVar54._4_4_ = (uint)bVar12 * auVar55._4_4_ | (uint)!bVar12 * auVar53._4_4_;
                  auVar54._0_4_ = auVar53._0_4_;
                  bVar12 = (bool)(bVar19 >> 2 & 1);
                  auVar54._8_4_ = (uint)bVar12 * auVar55._8_4_ | (uint)!bVar12 * auVar53._8_4_;
                  bVar12 = (bool)(bVar19 >> 3 & 1);
                  auVar54._12_4_ = (uint)bVar12 * auVar55._12_4_ | (uint)!bVar12 * auVar53._12_4_;
                  bVar12 = (bool)(bVar19 >> 4 & 1);
                  auVar54._16_4_ = (uint)bVar12 * auVar55._16_4_ | (uint)!bVar12 * auVar53._16_4_;
                  bVar12 = (bool)(bVar19 >> 5 & 1);
                  auVar54._20_4_ = (uint)bVar12 * auVar55._20_4_ | (uint)!bVar12 * auVar53._20_4_;
                  bVar12 = (bool)(bVar19 >> 6 & 1);
                  auVar54._24_4_ = (uint)bVar12 * auVar55._24_4_ | (uint)!bVar12 * auVar53._24_4_;
                  auVar54._28_4_ =
                       (uint)(bVar19 >> 7) * auVar55._28_4_ |
                       (uint)!(bool)(bVar19 >> 7) * auVar53._28_4_;
                  auVar65 = ZEXT3264(auVar54);
                } while (bVar26 != 0);
                lVar24 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
                do {
                  auVar53 = vpermi2q_avx512vl(auVar54,auVar51,auVar52);
                  (local_2618->ptr).ptr = auVar53._0_8_;
                  auVar55 = auVar65._0_32_;
                  auVar53 = vpermd_avx2(auVar55,auVar50);
                  local_2618->dist = auVar53._0_4_;
                  auVar54 = valignd_avx512vl(auVar55,auVar55,1);
                  local_2618 = local_2618 + 1;
                  auVar65 = ZEXT3264(auVar54);
                  lVar24 = lVar24 + -1;
                } while (lVar24 != 0);
                auVar50 = vpermt2q_avx512vl(auVar51,auVar54,auVar52);
                sVar32 = auVar50._0_8_;
              }
            }
          }
        }
      }
      local_2610 = (ulong)((uint)sVar32 & 0xf) - 8;
      if (local_2610 != 0) {
        uVar28 = sVar32 & 0xfffffffffffffff0;
        lVar24 = 0;
        do {
          lVar25 = lVar24 * 0x50;
          local_2628 = context->scene;
          ppfVar4 = (local_2628->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar28 + 0x30 + lVar25)];
          pfVar6 = ppfVar4[*(uint *)(uVar28 + 0x34 + lVar25)];
          pfVar7 = ppfVar4[*(uint *)(uVar28 + 0x38 + lVar25)];
          pfVar8 = ppfVar4[*(uint *)(uVar28 + 0x3c + lVar25)];
          auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 8 + lVar25)));
          auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + 8 + lVar25)));
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 4 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar28 + 0xc + lVar25)))
          ;
          auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 4 + lVar25)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar28 + 0xc + lVar25)))
          ;
          auVar41 = vunpcklps_avx(auVar35,auVar48);
          auVar39 = vunpcklps_avx(auVar47,auVar66);
          auVar40 = vunpckhps_avx(auVar47,auVar66);
          auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x10 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar28 + 0x18 + lVar25)));
          auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x10 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar28 + 0x18 + lVar25)));
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x14 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar28 + 0x1c + lVar25)));
          auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x14 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar28 + 0x1c + lVar25)));
          auVar45 = vunpcklps_avx(auVar35,auVar48);
          auVar38 = vunpcklps_avx(auVar47,auVar66);
          auVar48 = vunpckhps_avx(auVar47,auVar66);
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x20 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar28 + 0x28 + lVar25)));
          auVar35 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar28 + 0x20 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar28 + 0x28 + lVar25)));
          auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x24 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar28 + 0x2c + lVar25)));
          auVar47 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar28 + 0x24 + lVar25))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar28 + 0x2c + lVar25)));
          auVar36 = vunpcklps_avx(auVar35,auVar47);
          auVar37 = vunpcklps_avx(auVar66,auVar46);
          puVar1 = (undefined8 *)(uVar28 + 0x30 + lVar25);
          local_24f8 = *puVar1;
          uStack_24f0 = puVar1[1];
          auVar46 = vunpckhps_avx(auVar66,auVar46);
          puVar1 = (undefined8 *)(uVar28 + 0x40 + lVar25);
          local_25d8 = *puVar1;
          uStack_25d0 = puVar1[1];
          auVar35 = vsubps_avx(auVar39,auVar38);
          auVar48 = vsubps_avx(auVar40,auVar48);
          auVar47 = vsubps_avx(auVar41,auVar45);
          auVar66 = vsubps_avx(auVar37,auVar39);
          auVar46 = vsubps_avx(auVar46,auVar40);
          auVar45 = vsubps_avx(auVar36,auVar41);
          auVar36._0_4_ = auVar48._0_4_ * auVar45._0_4_;
          auVar36._4_4_ = auVar48._4_4_ * auVar45._4_4_;
          auVar36._8_4_ = auVar48._8_4_ * auVar45._8_4_;
          auVar36._12_4_ = auVar48._12_4_ * auVar45._12_4_;
          local_2548 = vfmsub231ps_fma(auVar36,auVar46,auVar47);
          auVar37._0_4_ = auVar47._0_4_ * auVar66._0_4_;
          auVar37._4_4_ = auVar47._4_4_ * auVar66._4_4_;
          auVar37._8_4_ = auVar47._8_4_ * auVar66._8_4_;
          auVar37._12_4_ = auVar47._12_4_ * auVar66._12_4_;
          local_2538 = vfmsub231ps_fma(auVar37,auVar45,auVar35);
          auVar42._0_4_ = auVar35._0_4_ * auVar46._0_4_;
          auVar42._4_4_ = auVar35._4_4_ * auVar46._4_4_;
          auVar42._8_4_ = auVar35._8_4_ * auVar46._8_4_;
          auVar42._12_4_ = auVar35._12_4_ * auVar46._12_4_;
          uVar57 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar70._4_4_ = uVar57;
          auVar70._0_4_ = uVar57;
          auVar70._8_4_ = uVar57;
          auVar70._12_4_ = uVar57;
          auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
          auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar57 = *(undefined4 *)(ray + k * 4);
          auVar38._4_4_ = uVar57;
          auVar38._0_4_ = uVar57;
          auVar38._8_4_ = uVar57;
          auVar38._12_4_ = uVar57;
          auVar38 = vsubps_avx512vl(auVar39,auVar38);
          local_2528 = vfmsub231ps_fma(auVar42,auVar66,auVar48);
          uVar57 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar39._4_4_ = uVar57;
          auVar39._0_4_ = uVar57;
          auVar39._8_4_ = uVar57;
          auVar39._12_4_ = uVar57;
          auVar39 = vsubps_avx512vl(auVar40,auVar39);
          uVar57 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar40._4_4_ = uVar57;
          auVar40._0_4_ = uVar57;
          auVar40._8_4_ = uVar57;
          auVar40._12_4_ = uVar57;
          auVar40 = vsubps_avx512vl(auVar41,auVar40);
          auVar41 = vmulps_avx512vl(auVar36,auVar40);
          auVar42 = vfmsub231ps_avx512vl(auVar41,auVar39,auVar37);
          auVar41 = vmulps_avx512vl(auVar37,auVar38);
          auVar43 = vfmsub231ps_avx512vl(auVar41,auVar40,auVar70);
          auVar41 = vmulps_avx512vl(auVar70,auVar39);
          auVar44 = vfmsub231ps_avx512vl(auVar41,auVar38,auVar36);
          auVar41 = vmulps_avx512vl(local_2528,auVar37);
          auVar41 = vfmadd231ps_avx512vl(auVar41,local_2538,auVar36);
          auVar36 = vfmadd231ps_avx512vl(auVar41,local_2548,auVar70);
          auVar41._8_4_ = 0x7fffffff;
          auVar41._0_8_ = 0x7fffffff7fffffff;
          auVar41._12_4_ = 0x7fffffff;
          local_2598 = vandps_avx512vl(auVar36,auVar41);
          auVar41 = vandps_avx512vl(auVar36,auVar81._0_16_);
          auVar45 = vmulps_avx512vl(auVar45,auVar44);
          auVar46 = vfmadd231ps_avx512vl(auVar45,auVar43,auVar46);
          auVar66 = vfmadd231ps_fma(auVar46,auVar42,auVar66);
          uVar67 = auVar41._0_4_;
          local_25c8._0_4_ = (float)(uVar67 ^ auVar66._0_4_);
          uVar27 = auVar41._4_4_;
          local_25c8._4_4_ = (float)(uVar27 ^ auVar66._4_4_);
          uVar31 = auVar41._8_4_;
          local_25c8._8_4_ = (float)(uVar31 ^ auVar66._8_4_);
          uVar68 = auVar41._12_4_;
          local_25c8._12_4_ = (float)(uVar68 ^ auVar66._12_4_);
          auVar47 = vmulps_avx512vl(auVar47,auVar44);
          auVar48 = vfmadd231ps_avx512vl(auVar47,auVar48,auVar43);
          auVar35 = vfmadd231ps_fma(auVar48,auVar35,auVar42);
          local_25b8._0_4_ = (float)(uVar67 ^ auVar35._0_4_);
          local_25b8._4_4_ = (float)(uVar27 ^ auVar35._4_4_);
          local_25b8._8_4_ = (float)(uVar31 ^ auVar35._8_4_);
          local_25b8._12_4_ = (float)(uVar68 ^ auVar35._12_4_);
          auVar35 = ZEXT816(0) << 0x20;
          uVar18 = vcmpps_avx512vl(local_25c8,auVar35,5);
          uVar15 = vcmpps_avx512vl(local_25b8,auVar35,5);
          uVar16 = vcmpps_avx512vl(auVar36,auVar35,4);
          auVar35._0_4_ = local_25c8._0_4_ + local_25b8._0_4_;
          auVar35._4_4_ = local_25c8._4_4_ + local_25b8._4_4_;
          auVar35._8_4_ = local_25c8._8_4_ + local_25b8._8_4_;
          auVar35._12_4_ = local_25c8._12_4_ + local_25b8._12_4_;
          uVar17 = vcmpps_avx512vl(auVar35,local_2598,2);
          bVar23 = (byte)uVar18 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
          if (bVar23 != 0) {
            auVar47._0_4_ = auVar40._0_4_ * local_2528._0_4_;
            auVar47._4_4_ = auVar40._4_4_ * local_2528._4_4_;
            auVar47._8_4_ = auVar40._8_4_ * local_2528._8_4_;
            auVar47._12_4_ = auVar40._12_4_ * local_2528._12_4_;
            auVar35 = vfmadd213ps_fma(auVar39,local_2538,auVar47);
            auVar35 = vfmadd213ps_fma(auVar38,local_2548,auVar35);
            uVar57 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar48._4_4_ = uVar57;
            auVar48._0_4_ = uVar57;
            auVar48._8_4_ = uVar57;
            auVar48._12_4_ = uVar57;
            auVar48 = vmulps_avx512vl(local_2598,auVar48);
            fVar69 = *(float *)(ray + k * 4 + 0x80);
            local_25a8._0_4_ = (float)(uVar67 ^ auVar35._0_4_);
            local_25a8._4_4_ = (float)(uVar27 ^ auVar35._4_4_);
            local_25a8._8_4_ = (float)(uVar31 ^ auVar35._8_4_);
            local_25a8._12_4_ = (float)(uVar68 ^ auVar35._12_4_);
            auVar66._0_4_ = fVar69 * local_2598._0_4_;
            auVar66._4_4_ = fVar69 * local_2598._4_4_;
            auVar66._8_4_ = fVar69 * local_2598._8_4_;
            auVar66._12_4_ = fVar69 * local_2598._12_4_;
            uVar18 = vcmpps_avx512vl(local_25a8,auVar66,2);
            uVar15 = vcmpps_avx512vl(auVar48,local_25a8,1);
            bVar23 = (byte)uVar18 & (byte)uVar15 & bVar23;
            if (bVar23 != 0) {
              local_2587 = bVar23;
              auVar35 = vrcp14ps_avx512vl(local_2598);
              auVar46._8_4_ = 0x3f800000;
              auVar46._0_8_ = 0x3f8000003f800000;
              auVar46._12_4_ = 0x3f800000;
              auVar48 = vfnmadd213ps_avx512vl(local_2598,auVar35,auVar46);
              auVar35 = vfmadd132ps_fma(auVar48,auVar35,auVar35);
              fVar60 = auVar35._0_4_;
              local_2558._0_4_ = fVar60 * local_25a8._0_4_;
              fVar61 = auVar35._4_4_;
              local_2558._4_4_ = fVar61 * local_25a8._4_4_;
              fVar62 = auVar35._8_4_;
              local_2558._8_4_ = fVar62 * local_25a8._8_4_;
              fVar63 = auVar35._12_4_;
              local_2558._12_4_ = fVar63 * local_25a8._12_4_;
              auVar59 = ZEXT1664(local_2558);
              local_2578[0] = fVar60 * local_25c8._0_4_;
              local_2578[1] = fVar61 * local_25c8._4_4_;
              local_2578[2] = fVar62 * local_25c8._8_4_;
              local_2578[3] = fVar63 * local_25c8._12_4_;
              local_2568[0] = fVar60 * local_25b8._0_4_;
              local_2568[1] = fVar61 * local_25b8._4_4_;
              local_2568[2] = fVar62 * local_25b8._8_4_;
              local_2568[3] = fVar63 * local_25b8._12_4_;
              auVar43._8_4_ = 0x7f800000;
              auVar43._0_8_ = 0x7f8000007f800000;
              auVar43._12_4_ = 0x7f800000;
              auVar35 = vblendmps_avx512vl(auVar43,local_2558);
              auVar45._0_4_ =
                   (uint)(bVar23 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar23 >> 1 & 1);
              auVar45._4_4_ = (uint)bVar12 * auVar35._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar23 >> 2 & 1);
              auVar45._8_4_ = (uint)bVar12 * auVar35._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar23 >> 3 & 1);
              auVar45._12_4_ = (uint)bVar12 * auVar35._12_4_ | (uint)!bVar12 * 0x7f800000;
              auVar35 = vshufps_avx(auVar45,auVar45,0xb1);
              auVar35 = vminps_avx(auVar35,auVar45);
              auVar48 = vshufpd_avx(auVar35,auVar35,1);
              auVar35 = vminps_avx(auVar48,auVar35);
              uVar18 = vcmpps_avx512vl(auVar45,auVar35,0);
              bVar26 = (byte)uVar18 & bVar23;
              do {
                bVar19 = bVar23;
                if (bVar26 != 0) {
                  bVar19 = bVar26;
                }
                uVar67 = 0;
                for (uVar27 = (uint)bVar19; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                  uVar67 = uVar67 + 1;
                }
                uVar31 = uVar67 & 0xff;
                local_2630 = (ulong)uVar31;
                uVar27 = *(uint *)((long)&local_24f8 + local_2630 * 4);
                local_2638 = (local_2628->geometries).items[uVar27].ptr;
                if ((local_2638->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar23 = ~(byte)(1 << (uVar67 & 0x1f)) & bVar23;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_2638->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar34 = (ulong)(uVar31 << 2);
                    uVar57 = *(undefined4 *)((long)local_2578 + uVar34);
                    uVar3 = *(undefined4 *)((long)local_2568 + uVar34);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar34);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2548 + uVar34);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2538 + uVar34);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2528 + uVar34);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar57;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_25d8 + uVar34);
                    *(uint *)(ray + k * 4 + 0x120) = uVar27;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_2518 = auVar59._0_16_;
                  auVar50 = vmovdqu64_avx512vl(auVar77._0_32_);
                  uVar34 = (ulong)(uVar31 * 4);
                  uVar57 = *(undefined4 *)((long)local_2578 + uVar34);
                  h.u.field_0.i[1] = uVar57;
                  h.u.field_0.i[0] = uVar57;
                  h.u.field_0.i[2] = uVar57;
                  h.u.field_0.i[3] = uVar57;
                  h.v.field_0.v[0] = *(float *)((long)local_2568 + uVar34);
                  h.geomID.field_0 =
                       (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                  uVar57 = *(undefined4 *)((long)&local_25d8 + uVar34);
                  h.primID.field_0.i[1] = uVar57;
                  h.primID.field_0.i[0] = uVar57;
                  h.primID.field_0.i[2] = uVar57;
                  h.primID.field_0.i[3] = uVar57;
                  uVar57 = *(undefined4 *)(local_2548 + uVar34);
                  h.Ng.field_0._4_4_ = uVar57;
                  h.Ng.field_0._0_4_ = uVar57;
                  h.Ng.field_0._8_4_ = uVar57;
                  h.Ng.field_0._12_4_ = uVar57;
                  h.Ng.field_0._16_4_ = *(undefined4 *)(local_2538 + uVar34);
                  uVar57 = *(undefined4 *)(local_2528 + uVar34);
                  h.Ng.field_0._36_4_ = uVar57;
                  h.Ng.field_0._32_4_ = uVar57;
                  h.Ng.field_0._40_4_ = uVar57;
                  h.Ng.field_0._44_4_ = uVar57;
                  h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
                  h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
                  h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
                  h.v.field_0.v[1] = h.v.field_0.v[0];
                  h.v.field_0.v[2] = h.v.field_0.v[0];
                  h.v.field_0.v[3] = h.v.field_0.v[0];
                  vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                                ZEXT1632((undefined1  [16])h.u.field_0));
                  h.instID[0].field_0.i[1] = context->user->instID[0];
                  h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                  h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                  h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                  h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                  h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                  h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                  h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar34);
                  auVar35 = auVar78._0_16_;
                  local_2648 = vmovdqa64_avx512vl(auVar35);
                  args.valid = (int *)local_2648;
                  args.geometryUserPtr = local_2638->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&h;
                  args.N = 4;
                  local_2508 = vmovdqa64_avx512vl(auVar35);
                  auVar35 = vmovdqa64_avx512vl(auVar35);
                  args.ray = (RTCRayN *)ray;
                  if (local_2638->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_2638->intersectionFilterN)(&args);
                    auVar35 = local_2648;
                  }
                  uVar34 = vptestmd_avx512vl(auVar35,auVar35);
                  if ((uVar34 & 0xf) == 0) {
LAB_007828af:
                    *(float *)(ray + k * 4 + 0x80) = fVar69;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_2638->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                      auVar35 = local_2648;
                    }
                    uVar34 = vptestmd_avx512vl(auVar35,auVar35);
                    uVar34 = uVar34 & 0xf;
                    bVar26 = (byte)uVar34;
                    if (bVar26 == 0) goto LAB_007828af;
                    iVar2 = *(int *)(args.hit + 4);
                    iVar20 = *(int *)(args.hit + 8);
                    iVar21 = *(int *)(args.hit + 0xc);
                    bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar11 = SUB81(uVar34 >> 3,0);
                    *(uint *)(args.ray + 0xc0) =
                         (uint)(bVar26 & 1) * *(int *)args.hit |
                         (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xc0);
                    *(uint *)(args.ray + 0xc4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(args.ray + 0xc4);
                    *(uint *)(args.ray + 200) =
                         (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 200);
                    *(uint *)(args.ray + 0xcc) =
                         (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xcc);
                    iVar2 = *(int *)(args.hit + 0x14);
                    iVar20 = *(int *)(args.hit + 0x18);
                    iVar21 = *(int *)(args.hit + 0x1c);
                    bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar11 = SUB81(uVar34 >> 3,0);
                    *(uint *)(args.ray + 0xd0) =
                         (uint)(bVar26 & 1) * *(int *)(args.hit + 0x10) |
                         (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xd0);
                    *(uint *)(args.ray + 0xd4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(args.ray + 0xd4);
                    *(uint *)(args.ray + 0xd8) =
                         (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xd8);
                    *(uint *)(args.ray + 0xdc) =
                         (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xdc);
                    iVar2 = *(int *)(args.hit + 0x24);
                    iVar20 = *(int *)(args.hit + 0x28);
                    iVar21 = *(int *)(args.hit + 0x2c);
                    bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar11 = SUB81(uVar34 >> 3,0);
                    *(uint *)(args.ray + 0xe0) =
                         (uint)(bVar26 & 1) * *(int *)(args.hit + 0x20) |
                         (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xe0);
                    *(uint *)(args.ray + 0xe4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(args.ray + 0xe4);
                    *(uint *)(args.ray + 0xe8) =
                         (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xe8);
                    *(uint *)(args.ray + 0xec) =
                         (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xec);
                    iVar2 = *(int *)(args.hit + 0x34);
                    iVar20 = *(int *)(args.hit + 0x38);
                    iVar21 = *(int *)(args.hit + 0x3c);
                    bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar11 = SUB81(uVar34 >> 3,0);
                    *(uint *)(args.ray + 0xf0) =
                         (uint)(bVar26 & 1) * *(int *)(args.hit + 0x30) |
                         (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xf0);
                    *(uint *)(args.ray + 0xf4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(args.ray + 0xf4);
                    *(uint *)(args.ray + 0xf8) =
                         (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xf8);
                    *(uint *)(args.ray + 0xfc) =
                         (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xfc);
                    iVar2 = *(int *)(args.hit + 0x44);
                    iVar20 = *(int *)(args.hit + 0x48);
                    iVar21 = *(int *)(args.hit + 0x4c);
                    bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar11 = SUB81(uVar34 >> 3,0);
                    *(uint *)(args.ray + 0x100) =
                         (uint)(bVar26 & 1) * *(int *)(args.hit + 0x40) |
                         (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0x100);
                    *(uint *)(args.ray + 0x104) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(args.ray + 0x104);
                    *(uint *)(args.ray + 0x108) =
                         (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0x108);
                    *(uint *)(args.ray + 0x10c) =
                         (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0x10c);
                    auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar35;
                    auVar35 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar35;
                    auVar35 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar35;
                    auVar35 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar35;
                    fVar69 = *(float *)(ray + k * 4 + 0x80);
                  }
                  auVar44._4_4_ = fVar69;
                  auVar44._0_4_ = fVar69;
                  auVar44._8_4_ = fVar69;
                  auVar44._12_4_ = fVar69;
                  auVar59 = ZEXT1664(local_2518);
                  uVar18 = vcmpps_avx512vl(local_2518,auVar44,2);
                  bVar23 = ~(byte)(1 << ((uint)local_2630 & 0x1f)) & bVar23 & (byte)uVar18;
                  auVar71 = ZEXT3264(auVar71._0_32_);
                  auVar72 = ZEXT3264(auVar72._0_32_);
                  auVar73 = ZEXT3264(auVar73._0_32_);
                  auVar74 = ZEXT3264(auVar74._0_32_);
                  auVar75 = ZEXT3264(auVar75._0_32_);
                  auVar76 = ZEXT3264(auVar76._0_32_);
                  auVar50 = vmovdqu64_avx512vl(auVar50);
                  auVar77 = ZEXT3264(auVar50);
                  auVar35 = vmovdqa64_avx512vl(local_2508);
                  auVar78 = ZEXT1664(auVar35);
                  auVar50 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                  auVar79 = ZEXT3264(auVar50);
                  auVar50 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                  auVar80 = ZEXT3264(auVar50);
                  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar81 = ZEXT1664(auVar35);
                  auVar50 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar82 = ZEXT3264(auVar50);
                }
                if (bVar23 == 0) break;
                auVar58._8_4_ = 0x7f800000;
                auVar58._0_8_ = 0x7f8000007f800000;
                auVar58._12_4_ = 0x7f800000;
                auVar35 = vblendmps_avx512vl(auVar58,auVar59._0_16_);
                auVar49._0_4_ =
                     (uint)(bVar23 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
                bVar12 = (bool)(bVar23 >> 1 & 1);
                auVar49._4_4_ = (uint)bVar12 * auVar35._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(bVar23 >> 2 & 1);
                auVar49._8_4_ = (uint)bVar12 * auVar35._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(bVar23 >> 3 & 1);
                auVar49._12_4_ = (uint)bVar12 * auVar35._12_4_ | (uint)!bVar12 * 0x7f800000;
                auVar35 = vshufps_avx(auVar49,auVar49,0xb1);
                auVar35 = vminps_avx(auVar35,auVar49);
                auVar48 = vshufpd_avx(auVar35,auVar35,1);
                auVar35 = vminps_avx(auVar48,auVar35);
                uVar18 = vcmpps_avx512vl(auVar49,auVar35,0);
                bVar26 = (byte)uVar18 & bVar23;
              } while( true );
            }
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != local_2610);
      }
      uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar59 = ZEXT3264(CONCAT428(uVar57,CONCAT424(uVar57,CONCAT420(uVar57,CONCAT416(uVar57,
                                                  CONCAT412(uVar57,CONCAT48(uVar57,CONCAT44(uVar57,
                                                  uVar57))))))));
      uVar28 = local_2620;
    }
LAB_00782a54:
    if (local_2618 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }